

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O1

void presolve::dev_kkt_check::checkBasicFeasibleSolution(State *state,KktConditionDetails *details)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  
  if (0 < state->numCol) {
    lVar6 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar6] != 0) {
        details->checked = details->checked + 1;
        dVar8 = 0.0;
        if (((state->col_status->
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar6] == kBasic) &&
           (1e-07 < ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar6]))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Col ",4);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," is basic but has nonzero dual ",0x1f);
          poVar2 = std::ostream::_M_insert<double>
                             ((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar6]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          dVar8 = ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
        }
        if (0.0 < dVar8) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar8 * dVar8 + details->sum_violation_2;
          if (details->max_violation <= dVar8 && dVar8 != details->max_violation) {
            details->max_violation = dVar8;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < state->numCol);
  }
  if (0 < state->numRow) {
    lVar6 = 0;
    do {
      if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar6] != 0) {
        details->checked = details->checked + 1;
        dVar8 = 0.0;
        if (((state->row_status->
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar6] == kBasic) &&
           (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar6]))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
          poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," is basic but has nonzero dual: ",0x20);
          poVar2 = std::ostream::_M_insert<double>
                             (ABS((state->rowDual->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar6]));
          std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          dVar8 = ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
        }
        if (0.0 < dVar8) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar8 * dVar8 + details->sum_violation_2;
          if (details->max_violation <= dVar8 && dVar8 != details->max_violation) {
            details->max_violation = dVar8;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < state->numRow);
  }
  if (details->violated == 0) {
    plVar3 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BFS.",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BFS X Violated: ",0x10);
    plVar3 = (long *)std::ostream::operator<<(&std::cout,details->violated);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar5 = 0;
  iVar4 = 0;
  iVar1 = 0;
  if (0 < (long)state->numRow) {
    lVar6 = 0;
    iVar1 = 0;
    iVar4 = 0;
    do {
      bVar7 = (state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar6] != 0;
      if (bVar7) {
        iVar1 = iVar1 + (uint)((state->row_status->
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar6] == kBasic);
      }
      iVar4 = iVar4 + (uint)bVar7;
      lVar6 = lVar6 + 1;
    } while (state->numRow != lVar6);
  }
  if (0 < (long)state->numCol) {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar6] != 0) {
        iVar5 = iVar5 + (uint)((state->col_status->
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar6] == kBasic);
      }
      lVar6 = lVar6 + 1;
    } while (state->numCol != lVar6);
  }
  if (iVar5 + iVar1 == iVar4) {
    return;
  }
  details->violated = -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BFS X Violated WRONG basis count: ",0x22);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar5 + iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void checkBasicFeasibleSolution(const State& state,
                                KktConditionDetails& details) {
  // Go over cols and check that the duals of basic values are zero.
  assert((int)state.col_status.size() == state.numCol);
  assert((int)state.colDual.size() == state.numCol);
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;
      if (state.col_status[j] == HighsBasisStatus::kBasic &&
          fabs(state.colDual[j]) > tol) {
        if (dev_print == 1)
          std::cout << "Col " << j << " is basic but has nonzero dual "
                    << state.colDual[j] << "." << std::endl;
        infeas = fabs(state.colDual[j]);
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // Go over rows and check that the duals of basic values are zero.
  assert((int)state.row_status.size() == state.numRow);
  assert((int)state.rowDual.size() == state.numRow);
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;
      double infeas = 0;
      if (state.row_status[i] == HighsBasisStatus::kBasic &&
          fabs(state.rowDual[i]) > tol) {
        if (dev_print == 1)
          std::cout << "Row " << i << " is basic but has nonzero dual: "
                    << fabs(state.rowDual[i]) << std::endl;
        infeas = fabs(state.rowDual[i]);
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "BFS." << std::endl;
  } else {
    if (dev_print == 1)
      std::cout << "BFS X Violated: " << details.violated << std::endl;
  }

  // check number of basic rows during postsolve.
  int current_n_rows = 0;
  int current_n_rows_basic = 0;
  int current_n_cols_basic = 0;

  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) current_n_rows++;

    if (state.flagRow[i] && state.row_status[i] == HighsBasisStatus::kBasic)
      current_n_rows_basic++;
  }

  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i] && state.col_status[i] == HighsBasisStatus::kBasic)
      current_n_cols_basic++;
  }

  bool holds = current_n_cols_basic + current_n_rows_basic == current_n_rows;
  if (!holds) {
    details.violated = -1;
    std::cout << "BFS X Violated WRONG basis count: "
              << current_n_cols_basic + current_n_rows_basic << " "
              << current_n_rows << std::endl;
  }
  //  assert(current_n_cols_basic + current_n_rows_basic == current_n_rows);
}